

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::NotEquals,bool,true,false>
               (interval_t *ldata,interval_t *rdata,bool *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  long lVar3;
  int64_t *piVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  idx_t iVar14;
  long lVar15;
  bool bVar16;
  int64_t *local_70;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar3._0_4_ = ldata->months;
      lVar3._4_4_ = ldata->days;
      lVar10 = ldata->micros;
      lVar11 = (lVar3 >> 0x20) + lVar10 / 86400000000;
      local_70 = &rdata->micros;
      iVar14 = 0;
      do {
        lVar15._0_4_ = ((interval_t *)(local_70 + -1))->months;
        lVar15._4_4_ = ((interval_t *)(local_70 + -1))->days;
        lVar6 = *local_70;
        if (lVar10 == lVar6 && lVar3 == lVar15) {
          bVar16 = false;
        }
        else {
          lVar12 = (lVar15 >> 0x20) + lVar6 / 86400000000;
          bVar16 = true;
          if (((long)(int)(undefined4)lVar3 + lVar11 / 0x1e ==
               (long)(int)(undefined4)lVar15 + lVar12 / 0x1e) && (lVar11 % 0x1e == lVar12 % 0x1e)) {
            bVar16 = lVar10 % 86400000000 != lVar6 % 86400000000;
          }
        }
        result_data[iVar14] = bVar16;
        iVar14 = iVar14 + 1;
        local_70 = local_70 + 2;
      } while (count != iVar14);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = 0;
    uVar8 = 0;
    do {
      uVar2 = puVar1[uVar5];
      uVar13 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar13 = count;
      }
      uVar7 = uVar13;
      if (uVar2 != 0) {
        uVar7 = uVar8;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar8 < uVar13) {
            lVar3 = ldata->micros;
            lVar6._0_4_ = ldata->months;
            lVar6._4_4_ = ldata->days;
            lVar10 = (lVar6 >> 0x20) + lVar3 / 86400000000;
            piVar4 = &rdata[uVar8].micros;
            do {
              lVar12._0_4_ = ((interval_t *)(piVar4 + -1))->months;
              lVar12._4_4_ = ((interval_t *)(piVar4 + -1))->days;
              lVar11 = *piVar4;
              if (lVar3 == lVar11 && lVar6 == lVar12) {
                bVar16 = false;
              }
              else {
                lVar15 = (lVar12 >> 0x20) + lVar11 / 86400000000;
                bVar16 = true;
                if (((long)(int)(undefined4)lVar6 + lVar10 / 0x1e ==
                     (long)(int)(undefined4)lVar12 + lVar15 / 0x1e) &&
                   (lVar10 % 0x1e == lVar15 % 0x1e)) {
                  bVar16 = lVar3 % 86400000000 != lVar11 % 86400000000;
                }
              }
              result_data[uVar7] = bVar16;
              uVar7 = uVar7 + 1;
              piVar4 = piVar4 + 2;
            } while (uVar13 != uVar7);
          }
        }
        else if (uVar8 < uVar13) {
          piVar4 = &rdata[uVar8].micros;
          uVar9 = 0;
          do {
            if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
              lVar10._0_4_ = ldata->months;
              lVar10._4_4_ = ldata->days;
              lVar3 = ldata->micros;
              lVar11._0_4_ = ((interval_t *)(piVar4 + -1))->months;
              lVar11._4_4_ = ((interval_t *)(piVar4 + -1))->days;
              lVar15 = *piVar4;
              if (lVar3 == lVar15 && lVar10 == lVar11) {
                bVar16 = false;
              }
              else {
                lVar6 = (lVar10 >> 0x20) + lVar3 / 86400000000;
                lVar12 = (lVar11 >> 0x20) + lVar15 / 86400000000;
                bVar16 = true;
                if (((long)(int)(undefined4)lVar10 + lVar6 / 0x1e ==
                     (long)(int)(undefined4)lVar11 + lVar12 / 0x1e) &&
                   (lVar6 % 0x1e == lVar12 % 0x1e)) {
                  bVar16 = lVar3 % 86400000000 != lVar15 % 86400000000;
                }
              }
              result_data[uVar8] = bVar16;
            }
            uVar8 = uVar8 + 1;
            piVar4 = piVar4 + 2;
            uVar9 = uVar9 + 1;
            uVar7 = uVar8;
          } while (uVar13 != uVar8);
        }
      }
      uVar5 = uVar5 + 1;
      uVar8 = uVar7;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}